

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O3

bool __thiscall server::captureservmode::baseinfo::enter(baseinfo *this,char *team)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(this->owner,team);
  if (iVar1 == 0) {
    this->owners = this->owners + 1;
  }
  else {
    iVar1 = this->enemies;
    iVar2 = strcmp(this->enemy,team);
    if (iVar1 == 0) {
      if (iVar2 != 0) {
        this->converted = 0;
        strncpy(this->enemy,team,0x104);
        this->enemy[0x103] = '\0';
      }
      this->enemies = 1;
      return true;
    }
    if (iVar2 == 0) {
      this->enemies = iVar1 + 1;
    }
  }
  return false;
}

Assistant:

bool enter(const char *team)
        {
            if(!strcmp(owner, team))
            {
                owners++;
                return false;
            }
            if(!enemies)
            {
                if(strcmp(enemy, team))
                {
                    converted = 0;
                    copystring(enemy, team);
                }
                enemies++;
                return true;
            }
            else if(strcmp(enemy, team)) return false;
            else enemies++;
            return false;
        }